

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

float NULLCMath::normalize3(float4 *v)

{
  float fVar1;
  float fVar2;
  
  fVar1 = v->z * v->z + v->x * v->x + v->y * v->y;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = 1.0 / fVar1;
  v->x = v->x * fVar2;
  v->y = v->y * fVar2;
  v->z = fVar2 * v->z;
  return fVar1;
}

Assistant:

float normalize3(float4* v)
	{
		float len = length3(v), invLen = 1.0f / len;
		v->x *= invLen;
		v->y *= invLen;
		v->z *= invLen;
		return len;
	}